

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

void new_localvar(LexState *ls,TString *name,int n)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  FuncState *fs;
  FuncState *pFVar4;
  GCObject *o;
  GCObject *pGVar5;
  long lVar6;
  undefined8 *puVar7;
  
  fs = ls->fs;
  if (199 < (int)((uint)fs->nactvar + n)) {
    errorlimit(fs,200,"local variables");
  }
  pFVar4 = ls->fs;
  o = (GCObject *)pFVar4->f;
  iVar2 = (o->p).sizelocvars;
  if (iVar2 <= pFVar4->nlocvars) {
    pGVar5 = (GCObject *)
             luaM_growaux_(ls->L,(o->h).gclist,&(o->p).sizelocvars,0x10,0x7fff,
                           "too many local variables");
    (o->h).gclist = pGVar5;
  }
  iVar3 = (o->p).sizelocvars;
  if (iVar2 < iVar3) {
    lVar6 = (long)iVar3 - (long)iVar2;
    puVar7 = (undefined8 *)((long)iVar2 * 0x10 + (long)(o->h).gclist);
    do {
      *puVar7 = 0;
      puVar7 = puVar7 + 2;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  *(TString **)((long)(o->h).gclist + (long)pFVar4->nlocvars * 0x10) = name;
  if ((((name->tsv).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
    luaC_barrierf(ls->L,o,(GCObject *)name);
  }
  uVar1 = pFVar4->nlocvars;
  pFVar4->nlocvars = uVar1 + 1;
  fs->actvar[(long)n + (ulong)fs->nactvar] = uVar1;
  return;
}

Assistant:

static void new_localvar (LexState *ls, TString *name, int n) {
  FuncState *fs = ls->fs;
  luaY_checklimit(fs, fs->nactvar+n+1, LUAI_MAXVARS, "local variables");
  fs->actvar[fs->nactvar+n] = cast(unsigned short, registerlocalvar(ls, name));
}